

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGuiStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiTextEditState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  unsigned_short *__src;
  unsigned_short *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = obj->CurLenW;
  if (iVar3 < pos) {
    __assert_fail("pos <= text_len",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x272d,
                  "bool ImGuiStb::STB_TEXTEDIT_INSERTCHARS(ImGuiTextEditState *, int, const ImWchar *, int)"
                 );
  }
  if (new_text_len + iVar3 < (obj->Text).Size) {
    lVar4 = (long)new_text_len;
    iVar2 = ImTextCountUtf8BytesFromStr(new_text,new_text + lVar4);
    if (obj->CurLenA + iVar2 < obj->BufSizeA) {
      puVar1 = (obj->Text).Data;
      if (iVar3 - pos != 0) {
        __src = puVar1 + pos;
        memmove(__src + lVar4,__src,(long)(iVar3 - pos) * 2);
      }
      memcpy(puVar1 + pos,new_text,lVar4 * 2);
      lVar4 = obj->CurLenW + lVar4;
      iVar3 = (int)lVar4;
      obj->CurLenW = iVar3;
      obj->CurLenA = obj->CurLenA + iVar2;
      if (iVar3 < (obj->Text).Size) {
        (obj->Text).Data[lVar4] = 0;
        return true;
      }
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4c0,
                    "value_type &ImVector<unsigned short>::operator[](int) [T = unsigned short]");
    }
  }
  return false;
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(STB_TEXTEDIT_STRING* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);
    if (new_text_len + text_len + 1 > obj->Text.Size)
        return false;

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufSizeA)
        return false;

    ImWchar* text = obj->Text.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->Text[obj->CurLenW] = '\0';

    return true;
}